

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

fdb_status convert_errno_to_fdb_status(int errno_value,fdb_status default_status)

{
  fdb_status default_status_local;
  int errno_value_local;
  fdb_status local_4;
  
  switch(errno_value) {
  case 1:
    local_4 = FDB_RESULT_EPERM;
    break;
  case 2:
    local_4 = FDB_RESULT_NO_SUCH_FILE;
    break;
  default:
    local_4 = default_status;
    break;
  case 5:
    local_4 = FDB_RESULT_EIO;
    break;
  case 6:
    local_4 = FDB_RESULT_ENXIO;
    break;
  case 9:
    local_4 = FDB_RESULT_EBADF;
    break;
  case 0xb:
    local_4 = FDB_RESULT_EAGAIN;
    break;
  case 0xc:
    local_4 = FDB_RESULT_ENOMEM;
    break;
  case 0xd:
    local_4 = FDB_RESULT_EACCESS;
    break;
  case 0xe:
    local_4 = FDB_RESULT_EFAULT;
    break;
  case 0x11:
    local_4 = FDB_RESULT_EEXIST;
    break;
  case 0x13:
    local_4 = FDB_RESULT_ENODEV;
    break;
  case 0x14:
    local_4 = FDB_RESULT_ENOTDIR;
    break;
  case 0x15:
    local_4 = FDB_RESULT_EISDIR;
    break;
  case 0x16:
    local_4 = FDB_RESULT_EINVAL;
    break;
  case 0x17:
    local_4 = FDB_RESULT_ENFILE;
    break;
  case 0x18:
    local_4 = FDB_RESULT_EMFILE;
    break;
  case 0x1b:
    local_4 = FDB_RESULT_EFBIG;
    break;
  case 0x1c:
    local_4 = FDB_RESULT_ENOSPC;
    break;
  case 0x1e:
    local_4 = FDB_RESULT_EROFS;
    break;
  case 0x24:
    local_4 = FDB_RESULT_ENAMETOOLONG;
    break;
  case 0x28:
    local_4 = FDB_RESULT_ELOOP;
    break;
  case 0x4b:
    local_4 = FDB_RESULT_EOVERFLOW;
    break;
  case 0x5f:
    local_4 = FDB_RESULT_EOPNOTSUPP;
    break;
  case 0x69:
    local_4 = FDB_RESULT_ENOBUFS;
  }
  return local_4;
}

Assistant:

fdb_status convert_errno_to_fdb_status(int errno_value,
                                       fdb_status default_status)
{
    switch (errno_value) {
    case EACCES:
        return FDB_RESULT_EACCESS;
    case EEXIST:
        return FDB_RESULT_EEXIST;
    case EFAULT:
        return FDB_RESULT_EFAULT;
    case EFBIG:
        return FDB_RESULT_EFBIG;
    case EINVAL:
        return FDB_RESULT_EINVAL;
    case EISDIR:
        return FDB_RESULT_EISDIR;
    case ELOOP:
        return FDB_RESULT_ELOOP;
    case EMFILE:
        return FDB_RESULT_EMFILE;
    case ENAMETOOLONG:
        return FDB_RESULT_ENAMETOOLONG;
    case ENFILE:
        return FDB_RESULT_ENFILE;
    case ENODEV:
        return FDB_RESULT_ENODEV;
    case ENOENT:
        return FDB_RESULT_NO_SUCH_FILE;
    case ENOMEM:
        return FDB_RESULT_ENOMEM;
    case ENOSPC:
        return FDB_RESULT_ENOSPC;
    case ENOTDIR:
        return FDB_RESULT_ENOTDIR;
    case ENXIO:
        return FDB_RESULT_ENXIO;
    case EOPNOTSUPP:
        return FDB_RESULT_EOPNOTSUPP;
    case EOVERFLOW:
        return FDB_RESULT_EOVERFLOW;
    case EPERM:
        return FDB_RESULT_EPERM;
    case EROFS:
        return FDB_RESULT_EROFS;
    case EBADF:
        return FDB_RESULT_EBADF;
    case EIO:
        return FDB_RESULT_EIO;
    case ENOBUFS:
        return FDB_RESULT_ENOBUFS;
    case EAGAIN:
        return FDB_RESULT_EAGAIN;

    default:
        return default_status;
    }
}